

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

return_of_t<std::__cxx11::basic_string<char>_(int)> * __thiscall
trompeloeil::
return_handler_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/mixins/Pipe.cpp:365:5)>
::call(return_of_t<std::__cxx11::basic_string<char>_(int)> *__return_storage_ptr__,
      return_handler_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_tests_functional_mixins_Pipe_cpp:365:5)>
      *this,trace_agent *agent,call_params_type_t<std::__cxx11::basic_string<char>_(int)> *params)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string
            (&local_38,
             *(params->super__Tuple_impl<0UL,_int_&>).super__Head_base<0UL,_int_&,_false>.
              _M_head_impl);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    local_58.field_2._8_8_ = local_38.field_2._8_8_;
  }
  else {
    local_58._M_dataplus._M_p = local_38._M_dataplus._M_p;
  }
  local_58._M_string_length = local_38._M_string_length;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::~string((string *)&local_38);
  trace_agent::trace_return<std::__cxx11::string>(__return_storage_ptr__,agent,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

return_of_t<Sig>
    call(
      trace_agent& agent,
      call_params_type_t<Sig>& params)
    override
    {
      return trace_return<return_of_t<Sig>>(agent, func, params);
    }